

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastGtS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  int v1;
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  uint32_t uVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint *puVar9;
  MessageLite **ppMVar10;
  MessageLite *pMVar11;
  ulong uVar12;
  string *psVar13;
  ushort *puVar14;
  char *pcVar15;
  ushort *puVar16;
  size_type sVar17;
  undefined8 uVar18;
  Arena *arena;
  pointer pcVar19;
  ushort *local_40 [2];
  
  if (data.field_0._0_2_ != 0) {
    pcVar15 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar15;
  }
  uVar3 = *(ushort *)ptr;
  if ((ulong)table->has_bits_offset != 0) {
    puVar9 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar9 = *puVar9 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  ppMVar10 = RefAt<google::protobuf::MessageLite*>(msg,(ulong)data.field_0 >> 0x30);
  lVar5 = *(long *)((long)&table->has_bits_offset +
                   ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  pMVar11 = *ppMVar10;
  if (pMVar11 == (MessageLite *)0x0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar11 = ClassData::New(*(ClassData **)(lVar5 + 0x20),arena);
    *ppMVar10 = pMVar11;
  }
  iVar7 = ctx->depth_;
  v1 = iVar7 + -1;
  ctx->depth_ = v1;
  if (iVar7 < 1) {
    puVar14 = (ushort *)0x0;
  }
  else {
    local_40[0] = (ushort *)(ptr + 2);
    iVar7 = ctx->group_depth_ + 1;
    ctx->group_depth_ = iVar7;
    while (bVar6 = ParseContext::Done(ctx,(char **)local_40), !bVar6) {
      uVar8 = (uint)*(byte *)(lVar5 + 8) & (uint)*local_40[0];
      if ((uVar8 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      uVar12 = (ulong)(uVar8 & 0xfffffff8);
      local_40[0] = (ushort *)
                    (**(code **)(lVar5 + 0x38 + uVar12 * 2))
                              (pMVar11,local_40[0],ctx,
                               (ulong)*local_40[0] ^ *(ulong *)(lVar5 + 0x40 + uVar12 * 2),lVar5,0);
      if ((local_40[0] == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)
         ) break;
    }
    puVar16 = local_40[0];
    if ((*(byte *)(lVar5 + 9) & 1) != 0) {
      puVar16 = (ushort *)(**(code **)(lVar5 + 0x28))(pMVar11,local_40[0],ctx);
    }
    if (puVar16 != (ushort *)0x0) {
      psVar13 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                          (v1,ctx->depth_,"old_depth == depth_");
      if (psVar13 != (string *)0x0) {
        pcVar19 = (psVar13->_M_dataplus)._M_p;
        sVar17 = psVar13->_M_string_length;
        uVar18 = 0x45b;
LAB_00144005:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,uVar18,sVar17,pcVar19);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)local_40);
      }
      psVar13 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                          (iVar7,ctx->group_depth_,"old_group_depth == group_depth_");
      if (psVar13 != (string *)0x0) {
        pcVar19 = (psVar13->_M_dataplus)._M_p;
        sVar17 = psVar13->_M_string_length;
        uVar18 = 0x45c;
        goto LAB_00144005;
      }
    }
    uVar1 = ctx->depth_;
    uVar2 = ctx->group_depth_;
    ctx->depth_ = uVar1 + 1;
    ctx->group_depth_ = uVar2 + -1;
    uVar4 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    puVar14 = (ushort *)0x0;
    if (uVar4 == (int)(char)uVar3 + (uint)uVar3 >> 1) {
      puVar14 = puVar16;
    }
  }
  return (char *)puVar14;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint16_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}